

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GRULayerParams::GRULayerParams(GRULayerParams *this,GRULayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  uint64 uVar3;
  WeightParams *pWVar4;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GRULayerParams_003d4fe0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->activations_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activations_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activations_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activations_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(from->activations_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->updategateweightmatrix_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->updategateweightmatrix_ = pWVar4;
  pWVar2 = from->resetgateweightmatrix_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->resetgateweightmatrix_ = pWVar4;
  pWVar2 = from->outputgateweightmatrix_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->outputgateweightmatrix_ = pWVar4;
  pWVar2 = from->updategaterecursionmatrix_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->updategaterecursionmatrix_ = pWVar4;
  pWVar2 = from->resetgaterecursionmatrix_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->resetgaterecursionmatrix_ = pWVar4;
  pWVar2 = from->outputgaterecursionmatrix_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->outputgaterecursionmatrix_ = pWVar4;
  pWVar2 = from->updategatebiasvector_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->updategatebiasvector_ = pWVar4;
  pWVar2 = from->resetgatebiasvector_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->resetgatebiasvector_ = pWVar4;
  pWVar2 = from->outputgatebiasvector_;
  if (pWVar2 == (WeightParams *)0x0 || from == (GRULayerParams *)&_GRULayerParams_default_instance_)
  {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->outputgatebiasvector_ = pWVar4;
  uVar3 = from->outputvectorsize_;
  this->inputvectorsize_ = from->inputvectorsize_;
  this->outputvectorsize_ = uVar3;
  *(undefined4 *)((long)&this->outputvectorsize_ + 7) =
       *(undefined4 *)((long)&from->outputvectorsize_ + 7);
  return;
}

Assistant:

GRULayerParams::GRULayerParams(const GRULayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      activations_(from.activations_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_updategateweightmatrix()) {
    updategateweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.updategateweightmatrix_);
  } else {
    updategateweightmatrix_ = NULL;
  }
  if (from.has_resetgateweightmatrix()) {
    resetgateweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.resetgateweightmatrix_);
  } else {
    resetgateweightmatrix_ = NULL;
  }
  if (from.has_outputgateweightmatrix()) {
    outputgateweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.outputgateweightmatrix_);
  } else {
    outputgateweightmatrix_ = NULL;
  }
  if (from.has_updategaterecursionmatrix()) {
    updategaterecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.updategaterecursionmatrix_);
  } else {
    updategaterecursionmatrix_ = NULL;
  }
  if (from.has_resetgaterecursionmatrix()) {
    resetgaterecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.resetgaterecursionmatrix_);
  } else {
    resetgaterecursionmatrix_ = NULL;
  }
  if (from.has_outputgaterecursionmatrix()) {
    outputgaterecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.outputgaterecursionmatrix_);
  } else {
    outputgaterecursionmatrix_ = NULL;
  }
  if (from.has_updategatebiasvector()) {
    updategatebiasvector_ = new ::CoreML::Specification::WeightParams(*from.updategatebiasvector_);
  } else {
    updategatebiasvector_ = NULL;
  }
  if (from.has_resetgatebiasvector()) {
    resetgatebiasvector_ = new ::CoreML::Specification::WeightParams(*from.resetgatebiasvector_);
  } else {
    resetgatebiasvector_ = NULL;
  }
  if (from.has_outputgatebiasvector()) {
    outputgatebiasvector_ = new ::CoreML::Specification::WeightParams(*from.outputgatebiasvector_);
  } else {
    outputgatebiasvector_ = NULL;
  }
  ::memcpy(&inputvectorsize_, &from.inputvectorsize_,
    reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.GRULayerParams)
}